

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O1

int main(void)

{
  Task *pTVar1;
  int nargs;
  ostream *poVar2;
  long *plVar3;
  Workitem *this;
  Task *itask;
  undefined8 *puVar4;
  char *pcVar5;
  bool test_ok;
  Observer o;
  arg_info *pargs;
  bool local_51;
  Observer local_50;
  arg_info *local_38;
  
  x = 0;
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::Observer::Observer(&local_50,true);
  depspawn::spawn<void(int&),int&>(g,&x);
  depspawn::spawn<void(int&),int&>(g,&x);
  depspawn::spawn<void(int&),int&>(f,&x);
  depspawn::Observer::~Observer(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x = ",4);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  local_51 = x == 0xc;
  depspawn::Observer::Observer(&local_50,true);
  local_38 = (arg_info *)0x0;
  nargs = depspawn::internal::
          fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,bool&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,bool&>
                    (&local_38,&x,&local_51);
  if ((depspawn::internal::TP == (Task *)0x0) ||
     (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
    depspawn::internal::start_master();
  }
  this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                   ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                    depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(this,local_38,nargs);
  pTVar1 = depspawn::internal::TP;
  itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                    ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                     &depspawn::internal::TP[9].next);
  (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (itask->func_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = h;
  puVar4[1] = &local_51;
  puVar4[2] = &x;
  *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar4;
  (itask->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<bool>))(int_&,_bool_&)>_>
       ::_M_invoke;
  (itask->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<bool>))(int_&,_bool_&)>_>
       ::_M_manager;
  itask->ctx_ = this;
  itask->next = pTVar1;
  depspawn::internal::Workitem::insert_in_worklist(this,itask);
  depspawn::Observer::~Observer(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TEST ",5);
  pcVar5 = "UNSUCCESSFUL";
  if (local_51 != false) {
    pcVar5 = "SUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar5,(ulong)(local_51 ^ 1) * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return local_51 ^ 1;
}

Assistant:

int main()
{ 
  x = 0;
  
  std::cout << CLOCKS_PER_SEC << std::endl;

  t0 = std::chrono::high_resolution_clock::now();
  
  { Observer o;
    
    spawn(g, x); //Sets x to 1
    spawn(g, x); //Sets x to 2
    spawn(f, x); //Sets x to 12
  }

  std::cout << "x = " << x << std::endl;

  bool test_ok = (x == 12);

  { Observer o;
    
    spawn(h, x, test_ok);
  }
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}